

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

double DamageTypeDefinition::GetMobjDamageFactor(FName *type,DmgFactors *factors)

{
  double *this;
  bool bVar1;
  DamageTypeDefinition *pDVar2;
  FName *local_78;
  FName local_5c [3];
  DamageTypeDefinition *dtd_1;
  double *local_48;
  double *pdf_1;
  DamageTypeDefinition *dtd;
  double *local_28;
  double *pdf;
  DmgFactors *factors_local;
  FName *type_local;
  
  pdf = (double *)factors;
  factors_local = (DmgFactors *)type;
  if (factors == (DmgFactors *)0x0) {
    bVar1 = FName::operator==(type,NAME_None);
    if (bVar1) {
      type_local = (FName *)0x3ff0000000000000;
    }
    else {
      FName::FName((FName *)((long)&pdf_1 + 4),type);
      pDVar2 = Get((FName *)((long)&pdf_1 + 4));
      if (pDVar2 == (DamageTypeDefinition *)0x0) {
        local_78 = (FName *)0x3ff0000000000000;
      }
      else {
        local_78 = (FName *)pDVar2->DefaultFactor;
      }
      type_local = local_78;
    }
  }
  else {
    FName::FName((FName *)((long)&dtd + 4),type);
    local_28 = TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CheckKey
                         (&factors->
                           super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>,
                          (FName *)((long)&dtd + 4));
    if (local_28 == (double *)0x0) {
      bVar1 = FName::operator==(type,NAME_None);
      this = pdf;
      if (bVar1) {
        type_local = (FName *)0x3ff0000000000000;
      }
      else {
        FName::FName((FName *)((long)&dtd_1 + 4),NAME_None);
        local_48 = TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CheckKey
                             ((TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)this
                              ,(FName *)((long)&dtd_1 + 4));
        FName::FName(local_5c,type);
        pDVar2 = Get(local_5c);
        if (local_48 == (double *)0x0) {
          if (pDVar2 == (DamageTypeDefinition *)0x0) {
            type_local = (FName *)0x3ff0000000000000;
          }
          else {
            type_local = (FName *)pDVar2->DefaultFactor;
          }
        }
        else if (pDVar2 == (DamageTypeDefinition *)0x0) {
          type_local = (FName *)*local_48;
        }
        else if ((pDVar2->ReplaceFactor & 1U) == 0) {
          type_local = (FName *)(*local_48 * pDVar2->DefaultFactor);
        }
        else {
          type_local = (FName *)pDVar2->DefaultFactor;
        }
      }
    }
    else {
      type_local = (FName *)*local_28;
    }
  }
  return (double)type_local;
}

Assistant:

double DamageTypeDefinition::GetMobjDamageFactor(FName type, DmgFactors const * const factors)
{
	if (factors)
	{
		// If the actor has named damage factors, look for a specific factor

		auto pdf = factors->CheckKey(type);
		if (pdf) return *pdf; // type specific damage type
		
		// If this was nonspecific damage, don't fall back to nonspecific search
		if (type == NAME_None) return 1.;
	}
	
	// If this was nonspecific damage, don't fall back to nonspecific search
	else if (type == NAME_None) 
	{ 
		return 1.;
	}
	else
	{
		// Normal is unsupplied / 1.0, so there's no difference between modifying and overriding
		DamageTypeDefinition *dtd = Get(type);
		return dtd ? dtd->DefaultFactor : 1.;
	}
	
	{
		auto pdf  = factors->CheckKey(NAME_None);
		DamageTypeDefinition *dtd = Get(type);
		// Here we are looking for modifications to untyped damage
		// If the calling actor defines untyped damage factor, that is contained in "pdf".
		if (pdf) // normal damage available
		{
			if (dtd)
			{
				if (dtd->ReplaceFactor) return dtd->DefaultFactor; // use default instead of untyped factor
				return *pdf * dtd->DefaultFactor; // use default as modification of untyped factor
			}
			return *pdf; // there was no default, so actor default is used
		}
		else if (dtd)
		{
			return dtd->DefaultFactor; // implicit untyped factor 1.0 does not need to be applied/replaced explicitly
		}
	}
	return 1.;
}